

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_h_predictor_32x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ptrdiff_t in_RDX;
  uint8_t *in_RSI;
  __m128i *in_RDI;
  __m128i left_col_8p;
  __m128i left_col;
  __m128i *palVar1;
  
  h_prediction_32x8_1(in_RDI,in_RSI,in_RDX);
  palVar1 = (__m128i *)((long)*in_RDI + (long)in_RSI * 4);
  h_prediction_32x8_2(palVar1,in_RSI,in_RDX);
  palVar1 = (__m128i *)((long)*palVar1 + (long)in_RSI * 4);
  h_prediction_32x8_1(palVar1,in_RSI,in_RDX);
  h_prediction_32x8_2((__m128i *)((long)*palVar1 + (long)in_RSI * 4),in_RSI,in_RDX);
  return;
}

Assistant:

void aom_h_predictor_32x16_sse2(uint8_t *dst, ptrdiff_t stride,
                                const uint8_t *above, const uint8_t *left) {
  __m128i left_col, left_col_8p;
  (void)above;

  left_col = _mm_load_si128((const __m128i *)left);

  left_col_8p = _mm_unpacklo_epi8(left_col, left_col);
  h_prediction_32x8_1(&left_col_8p, dst, stride);
  dst += stride << 2;
  h_prediction_32x8_2(&left_col_8p, dst, stride);
  dst += stride << 2;

  left_col_8p = _mm_unpackhi_epi8(left_col, left_col);
  h_prediction_32x8_1(&left_col_8p, dst, stride);
  dst += stride << 2;
  h_prediction_32x8_2(&left_col_8p, dst, stride);
}